

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3VdbeAddFunctionCall
              (Parse *pParse,int p1,int p2,int p3,int nArg,FuncDef *pFunc,int eCallCtx)

{
  int op;
  int iVar1;
  undefined8 *puVar2;
  Parse *in_RDI;
  int in_R8D;
  undefined8 in_R9;
  sqlite3_context *pCtx;
  int addr;
  int nByte;
  Vdbe *v;
  undefined4 in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffbc;
  int p1_00;
  Vdbe *p;
  int local_4;
  
  p = in_RDI->pVdbe;
  p1_00 = -0x55555556;
  op = (in_R8D + -1) * 8 + 0x38;
  puVar2 = (undefined8 *)sqlite3DbMallocRawNN((sqlite3 *)CONCAT44(op,0xaaaaaaaa),0xaaaaaaaaaaaaaaaa)
  ;
  if (puVar2 == (undefined8 *)0x0) {
    freeEphemeralFunction
              ((sqlite3 *)0x0,
               (FuncDef *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
    local_4 = 0;
  }
  else {
    *puVar2 = 0;
    puVar2[1] = in_R9;
    puVar2[3] = 0;
    *(undefined4 *)((long)puVar2 + 0x24) = 0;
    *(short *)((long)puVar2 + 0x2a) = (short)in_R8D;
    iVar1 = sqlite3VdbeCurrentAddr(p);
    *(int *)(puVar2 + 4) = iVar1;
    local_4 = sqlite3VdbeAddOp4(p,op,p1_00,(int)((ulong)puVar2 >> 0x20),(int)puVar2,
                                (char *)CONCAT44(in_stack_ffffffffffffffbc,0xfffffff1),in_R8D);
    sqlite3VdbeChangeP5(p,(ushort)pCtx & 0x2e);
    sqlite3MayAbort(in_RDI);
  }
  return local_4;
}

Assistant:

SQLITE_PRIVATE int sqlite3VdbeAddFunctionCall(
  Parse *pParse,        /* Parsing context */
  int p1,               /* Constant argument mask */
  int p2,               /* First argument register */
  int p3,               /* Register into which results are written */
  int nArg,             /* Number of argument */
  const FuncDef *pFunc, /* The function to be invoked */
  int eCallCtx          /* Calling context */
){
  Vdbe *v = pParse->pVdbe;
  int nByte;
  int addr;
  sqlite3_context *pCtx;
  assert( v );
  nByte = sizeof(*pCtx) + (nArg-1)*sizeof(sqlite3_value*);
  pCtx = sqlite3DbMallocRawNN(pParse->db, nByte);
  if( pCtx==0 ){
    assert( pParse->db->mallocFailed );
    freeEphemeralFunction(pParse->db, (FuncDef*)pFunc);
    return 0;
  }
  pCtx->pOut = 0;
  pCtx->pFunc = (FuncDef*)pFunc;
  pCtx->pVdbe = 0;
  pCtx->isError = 0;
  pCtx->argc = nArg;
  pCtx->iOp = sqlite3VdbeCurrentAddr(v);
  addr = sqlite3VdbeAddOp4(v, eCallCtx ? OP_PureFunc : OP_Function,
                           p1, p2, p3, (char*)pCtx, P4_FUNCCTX);
  sqlite3VdbeChangeP5(v, eCallCtx & NC_SelfRef);
  sqlite3MayAbort(pParse);
  return addr;
}